

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLtarjan.c
# Opt level: O3

RDL_BCCGraph * RDL_tarjanBCC(RDL_graph *graph)

{
  size_t __size;
  int *piVar1;
  uint uVar2;
  void *pvVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  RDL_stack *stack;
  RDL_stack *stack_00;
  undefined4 *element;
  uint *puVar9;
  RDL_BCCGraph *pRVar10;
  RDL_graph **ppRVar11;
  uint **ppuVar12;
  uint **__s;
  uint **__s_00;
  uint *__s_01;
  uint **__s_02;
  uint *puVar13;
  ulong uVar14;
  uint *puVar15;
  long lVar16;
  RDL_graph *pRVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  size_t sVar24;
  uint uVar25;
  bool bVar26;
  uint uVar27;
  int iVar28;
  bool bVar29;
  uint local_50;
  uint local_4c;
  void *local_48;
  void *local_40;
  ulong local_38;
  
  sVar24 = (ulong)graph->V << 2;
  pvVar6 = malloc(sVar24);
  pvVar7 = malloc(sVar24);
  uVar18 = graph->E;
  sVar24 = (ulong)uVar18 * 4;
  pvVar8 = malloc(sVar24);
  if ((ulong)uVar18 != 0) {
    memset(pvVar8,0,sVar24);
  }
  stack = RDL_stack_new();
  uVar22 = (ulong)graph->V;
  local_48 = pvVar8;
  if (uVar22 == 0) {
    uVar18 = 0;
  }
  else {
    memset(pvVar6,0,uVar22 << 2);
    memset(pvVar7,0,uVar22 << 2);
    uVar21 = 0;
    iVar28 = 1;
    uVar18 = 0;
    do {
      if (*(int *)((long)pvVar6 + uVar21 * 4) == 0) {
        stack_00 = RDL_stack_new();
        element = (undefined4 *)malloc((ulong)graph->V << 4);
        *element = (int)uVar21;
        *(undefined8 *)(element + 1) = 0xffffffff;
        element[3] = 0xffffffff;
        uVar18 = uVar18 + 1;
        *(uint *)((long)pvVar6 + uVar21 * 4) = uVar18;
        *(uint *)((long)pvVar7 + uVar21 * 4) = uVar18;
        RDL_stack_push(stack_00,element);
        pvVar8 = malloc((ulong)graph->E << 2);
        iVar4 = RDL_stack_empty(stack_00);
        if (iVar4 == 0) {
          uVar23 = 0;
          local_40 = (void *)CONCAT44(local_40._4_4_,1);
          do {
            puVar9 = (uint *)RDL_stack_top(stack_00);
            uVar2 = *puVar9;
            uVar22 = (ulong)uVar2;
            if (puVar9[2] < graph->degree[uVar22]) {
              uVar19 = puVar9[1];
              uVar27 = graph->adjList[uVar22][puVar9[2]][0];
              uVar20 = (ulong)uVar27;
              uVar5 = RDL_edgeId(graph,uVar2,uVar27);
              pvVar3 = local_48;
              uVar25 = *(uint *)((long)pvVar6 + uVar20 * 4);
              if (uVar25 == 0) {
                *(uint *)((long)pvVar8 + (ulong)uVar23 * 4) = uVar5;
                RDL_stack_push(stack,(void *)((long)pvVar8 + (ulong)uVar23 * 4));
                uVar23 = uVar23 + 1;
                uVar18 = uVar18 + 1;
                *(uint *)((long)pvVar6 + uVar20 * 4) = uVar18;
                *(uint *)((long)pvVar7 + uVar20 * 4) = uVar18;
                uVar22 = (ulong)local_40 & 0xffffffff;
                local_40 = (void *)CONCAT44(local_40._4_4_,(int)local_40 + 1);
                element[uVar22 * 4] = uVar27;
                element[uVar22 * 4 + 1] = uVar2;
                *(undefined8 *)(element + uVar22 * 4 + 2) = 0xffffffff00000000;
                RDL_stack_push(stack_00,element + uVar22 * 4);
                puVar9[3] = uVar18;
              }
              else {
                puVar9[2] = puVar9[2] + 1;
                if (uVar25 == puVar9[3]) {
                  uVar2 = *(uint *)((long)pvVar7 + uVar22 * 4);
                  uVar19 = *(uint *)((long)pvVar7 + uVar20 * 4);
                  if (uVar2 < uVar19) {
                    uVar19 = uVar2;
                  }
                  *(uint *)((long)pvVar7 + uVar22 * 4) = uVar19;
                  if (*(uint *)((long)pvVar6 + uVar22 * 4) <= *(uint *)((long)pvVar7 + uVar20 * 4))
                  {
                    do {
                      puVar9 = (uint *)RDL_stack_top(stack);
                      uVar2 = *puVar9;
                      RDL_stack_pop(stack);
                      *(int *)((long)pvVar3 + (ulong)uVar2 * 4) = iVar28;
                    } while (uVar2 != uVar5);
                    iVar28 = iVar28 + 1;
                  }
                }
                else if ((uVar25 < *(uint *)((long)pvVar6 + uVar22 * 4)) && (uVar27 != uVar19)) {
                  *(uint *)((long)pvVar8 + (ulong)uVar23 * 4) = uVar5;
                  RDL_stack_push(stack,(void *)((long)pvVar8 + (ulong)uVar23 * 4));
                  uVar23 = uVar23 + 1;
                  uVar2 = *(uint *)((long)pvVar7 + uVar22 * 4);
                  if (uVar2 < uVar25) {
                    uVar25 = uVar2;
                  }
                  *(uint *)((long)pvVar7 + uVar22 * 4) = uVar25;
                }
              }
            }
            else {
              RDL_stack_pop(stack_00);
            }
            iVar4 = RDL_stack_empty(stack_00);
          } while (iVar4 == 0);
        }
        free(pvVar8);
        free(element);
        RDL_stack_delete(stack_00);
        uVar22 = (ulong)graph->V;
        pvVar8 = local_48;
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 < uVar22);
    uVar18 = iVar28 - 1;
  }
  free(pvVar6);
  free(pvVar7);
  RDL_stack_delete(stack);
  pRVar10 = (RDL_BCCGraph *)malloc(0x50);
  uVar22 = (ulong)uVar18;
  sVar24 = uVar22 * 4;
  pvVar6 = malloc(sVar24);
  pvVar7 = malloc(sVar24);
  if (uVar18 != 0) {
    memset(pvVar6,0,sVar24);
  }
  local_38 = (ulong)graph->E;
  if (local_38 != 0) {
    uVar21 = 0;
    do {
      iVar28 = *(int *)((long)pvVar8 + uVar21 * 4);
      if (iVar28 == 0) {
        (*RDL_outputFunc)(RDL_ERROR,"edge has no associated BCC %u\n");
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rareylab[P]RingDecomposerLib/src/RingDecomposerLib/RDLtarjan.c"
                      ,0xdd,"RDL_BCCGraph *RDL_tarjanBCC(const RDL_graph *)");
      }
      piVar1 = (int *)((long)pvVar6 + (ulong)(iVar28 - 1) * 4);
      *piVar1 = *piVar1 + 1;
      uVar21 = uVar21 + 1;
    } while (local_38 != uVar21);
  }
  if (uVar22 == 0) {
    uVar21 = 0;
  }
  else {
    uVar20 = 0;
    uVar21 = 0;
    do {
      bVar29 = *(uint *)((long)pvVar6 + uVar20 * 4) < 2;
      uVar18 = 0xfffffffd;
      if (!bVar29) {
        uVar18 = (uint)uVar21;
      }
      uVar21 = (ulong)(((uint)uVar21 + 1) - (uint)bVar29);
      *(uint *)((long)pvVar7 + uVar20 * 4) = uVar18;
      uVar20 = uVar20 + 1;
    } while (uVar22 != uVar20);
  }
  pRVar10->complete_graph = graph;
  uVar18 = (uint)uVar21;
  sVar24 = uVar21 * 8;
  ppRVar11 = (RDL_graph **)malloc(sVar24);
  uVar22 = local_38;
  pRVar10->bcc_graphs = ppRVar11;
  ppuVar12 = (uint **)malloc(local_38 * 8);
  pRVar10->edge_to_bcc_mapping = ppuVar12;
  if ((int)uVar22 != 0) {
    uVar20 = 0;
    do {
      puVar9 = (uint *)malloc(8);
      ppuVar12[uVar20] = puVar9;
      *puVar9 = 0xfffffffd;
      puVar9[1] = 0xfffffffd;
      uVar20 = uVar20 + 1;
    } while (uVar22 != uVar20);
  }
  __s = (uint **)malloc(sVar24);
  pRVar10->edge_from_bcc_mapping = __s;
  __size = uVar21 * 4;
  puVar9 = (uint *)malloc(__size);
  pRVar10->nof_edges_per_bcc = puVar9;
  if (uVar18 != 0) {
    memset(__s,0,sVar24);
    memset(puVar9,0,__size);
  }
  uVar22 = (ulong)graph->V;
  __s_00 = (uint **)malloc(uVar22 * 8);
  pRVar10->node_to_bcc_mapping = __s_00;
  __s_01 = (uint *)malloc(uVar22 * 4);
  pRVar10->nof_bcc_per_node = __s_01;
  if (uVar22 != 0) {
    memset(__s_01,0,uVar22 * 4);
    memset(__s_00,0,uVar22 * 8);
  }
  __s_02 = (uint **)malloc(sVar24);
  pRVar10->node_from_bcc_mapping = __s_02;
  puVar13 = (uint *)malloc(__size);
  pRVar10->nof_nodes_per_bcc = puVar13;
  if (uVar18 != 0) {
    memset(__s_02,0,sVar24);
    memset(puVar13,0,__size);
  }
  pRVar10->nof_bcc = uVar18;
  if ((int)local_38 == 0) {
    uVar22 = 0;
  }
  else {
    uVar20 = 0;
    uVar22 = local_38;
    local_40 = pvVar6;
    do {
      uVar14 = (ulong)(*(int *)((long)local_48 + uVar20 * 4) - 1);
      if (1 < *(uint *)((long)pvVar6 + uVar14 * 4)) {
        uVar23 = *(uint *)((long)pvVar7 + uVar14 * 4);
        puVar15 = ppuVar12[uVar20];
        *puVar15 = uVar23;
        uVar2 = puVar9[uVar23];
        puVar9[uVar23] = uVar2 + 1;
        puVar15[1] = uVar2;
        puVar15 = (uint *)realloc(__s[uVar23],(ulong)puVar9[uVar23] << 2);
        __s[uVar23] = puVar15;
        puVar15[puVar9[uVar23] - 1] = (uint)uVar20;
        lVar16 = 0;
        bVar29 = true;
        do {
          bVar26 = bVar29;
          uVar2 = graph->edges[uVar20][lVar16];
          uVar19 = __s_01[uVar2];
          if ((ulong)uVar19 == 0) {
LAB_0010baf7:
            __s_01[uVar2] = uVar19 + 1;
            puVar15 = (uint *)realloc(__s_00[uVar2],(ulong)(uVar19 * 2 + 2) << 3);
            __s_00[uVar2] = puVar15;
            uVar27 = __s_01[uVar2];
            puVar15[uVar27 * 2 - 2] = uVar23;
            uVar25 = puVar13[uVar23];
            uVar19 = uVar25 + 1;
            puVar13[uVar23] = uVar19;
            puVar15[uVar27 * 2 - 1] = uVar25;
            puVar15 = (uint *)realloc(__s_02[uVar23],(ulong)uVar19 << 2);
            __s_02[uVar23] = puVar15;
            puVar15[puVar13[uVar23] - 1] = uVar2;
          }
          else {
            uVar22 = 1;
            uVar27 = 0;
            do {
              uVar14 = (ulong)uVar27;
              if (uVar19 <= uVar22) break;
              uVar27 = uVar27 + 2;
              uVar22 = uVar22 + 1;
            } while (__s_00[uVar2][uVar14] != uVar23);
            if (__s_00[uVar2][uVar14] != uVar23) goto LAB_0010baf7;
          }
          lVar16 = 1;
          bVar29 = false;
        } while (bVar26);
        uVar22 = (ulong)graph->E;
        pvVar6 = local_40;
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 < (uVar22 & 0xffffffff));
  }
  if (uVar18 != 0) {
    uVar22 = 0;
    do {
      pRVar17 = RDL_initNewGraph(puVar13[uVar22]);
      ppRVar11[uVar22] = pRVar17;
      uVar22 = uVar22 + 1;
    } while (uVar21 != uVar22);
    uVar22 = (ulong)graph->E;
  }
  if ((int)uVar22 != 0) {
    uVar21 = 0;
    do {
      uVar18 = *ppuVar12[uVar21];
      if (uVar18 != 0xfffffffd) {
        local_50 = 0xfffffffd;
        local_4c = 0xfffffffd;
        puVar9 = graph->edges[uVar21];
        lVar16 = 0;
        puVar13 = &local_4c;
        bVar29 = true;
        do {
          bVar26 = bVar29;
          uVar23 = __s_01[puVar9[lVar16]];
          if ((ulong)uVar23 != 0) {
            puVar15 = __s_00[puVar9[lVar16]];
            uVar22 = 0;
            do {
              if (puVar15[uVar22 & 0xffffffff] == uVar18) {
                *puVar13 = puVar15[(int)uVar22 + 1];
              }
              uVar22 = uVar22 + 2;
            } while ((ulong)uVar23 * 2 != uVar22);
          }
          if (*puVar13 == 0xfffffffd) {
            (*RDL_outputFunc)(RDL_ERROR,"node %u not part of BCC %u!\n");
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rareylab[P]RingDecomposerLib/src/RingDecomposerLib/RDLtarjan.c"
                          ,0x14f,"RDL_BCCGraph *RDL_tarjanBCC(const RDL_graph *)");
          }
          lVar16 = 1;
          puVar13 = &local_50;
          bVar29 = false;
        } while (bVar26);
        RDL_addUEdge(ppRVar11[uVar18],local_4c,local_50);
        uVar22 = (ulong)graph->E;
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 < (uVar22 & 0xffffffff));
  }
  free(local_48);
  free(pvVar6);
  free(pvVar7);
  return pRVar10;
}

Assistant:

RDL_BCCGraph* RDL_tarjanBCC(const RDL_graph* graph)
{
  unsigned *bcc, u, node, i, j, k, ii[2],
    nof_bcc, *bcc_size, nof_nontrivial_bcc=0, curr_bcc, found;
  unsigned *non_trivial_mapping;
  RDL_BCCGraph* result;

  nof_bcc = RDL_tarjan(graph, &bcc);

  result = malloc(sizeof(*result));
  bcc_size = malloc(nof_bcc * sizeof(*bcc_size));
  non_trivial_mapping = malloc(nof_bcc * sizeof(*non_trivial_mapping));

  for (i = 0; i < nof_bcc; ++i) {
    bcc_size[i] = 0;
  }

  for (i = 0; i < graph->E; ++i) {
    if (bcc[i] == 0) {
      RDL_outputFunc(RDL_ERROR, "edge has no associated BCC %u\n", i);
      assert(0); /* should NEVER happen */
    }
    curr_bcc = bcc[i];
    ++bcc_size[curr_bcc - 1];
  }

  for (i = 0; i < nof_bcc; ++i) {
    if(bcc_size[i] > 1) {
      non_trivial_mapping[i] = nof_nontrivial_bcc;
      ++nof_nontrivial_bcc;
    }
    else {
      non_trivial_mapping[i] = RDL_NO_RINGSYSTEM;
    }
  }

  result->complete_graph = graph;

  result->bcc_graphs = malloc(nof_nontrivial_bcc * sizeof(*result->bcc_graphs));
  result->edge_to_bcc_mapping = malloc(graph->E * sizeof(*result->edge_to_bcc_mapping));

  for (i = 0; i < graph->E; ++i) {
    result->edge_to_bcc_mapping[i] = malloc(2 * sizeof(**result->edge_to_bcc_mapping));
    result->edge_to_bcc_mapping[i][0] = RDL_NO_RINGSYSTEM;
    result->edge_to_bcc_mapping[i][1] = RDL_NO_RINGSYSTEM;
  }

  result->edge_from_bcc_mapping = malloc(nof_nontrivial_bcc * sizeof(*result->edge_from_bcc_mapping));
  result->nof_edges_per_bcc = malloc(nof_nontrivial_bcc * sizeof(*result->nof_edges_per_bcc));
  for (i = 0; i < nof_nontrivial_bcc; ++i) {
    result->edge_from_bcc_mapping[i] = NULL;
    result->nof_edges_per_bcc[i] = 0;
  }

  result->node_to_bcc_mapping = malloc(graph->V * sizeof(*result->node_to_bcc_mapping));
  result->nof_bcc_per_node = malloc(graph->V * sizeof(*result->nof_bcc_per_node));
  for (i = 0; i < graph->V; ++i) {
    result->nof_bcc_per_node[i] = 0;
    result->node_to_bcc_mapping[i] = NULL;
  }

  result->node_from_bcc_mapping = malloc(nof_nontrivial_bcc * sizeof(*result->node_from_bcc_mapping));
  result->nof_nodes_per_bcc = malloc(nof_nontrivial_bcc * sizeof(*result->nof_nodes_per_bcc));
  for (i = 0; i < nof_nontrivial_bcc; ++i) {
    result->node_from_bcc_mapping[i] = NULL;
    result->nof_nodes_per_bcc[i] = 0;
  }

  result->nof_bcc = nof_nontrivial_bcc;

  for (i = 0; i < graph->E; ++i) {
    curr_bcc = bcc[i];

    /* skip trivial BCCs */
    if (bcc_size[curr_bcc-1] <= 1) {
      continue;
    }

    /* -1 because of 1-based BCCs */
    u = non_trivial_mapping[curr_bcc - 1];
    result->edge_to_bcc_mapping[i][0] = u;
    result->edge_to_bcc_mapping[i][1] = result->nof_edges_per_bcc[u]++;
    result->edge_from_bcc_mapping[u] = realloc(result->edge_from_bcc_mapping[u],
        result->nof_edges_per_bcc[u] * sizeof(**result->edge_from_bcc_mapping));
    result->edge_from_bcc_mapping[u][result->nof_edges_per_bcc[u] - 1] = i;

    for (k = 0; k <= 1; ++k) {
      node = graph->edges[i][k];

      found = 0;
      for (j = 0; j < result->nof_bcc_per_node[node] && !found; ++j) {
        if (result->node_to_bcc_mapping[node][2 * j] == u) {
          found = 1;
        }
      }

      if (!found) {
        ++result->nof_bcc_per_node[node];
        result->node_to_bcc_mapping[node] = realloc(result->node_to_bcc_mapping[node],
            2*result->nof_bcc_per_node[node]*sizeof(result->node_to_bcc_mapping[node]));
        result->node_to_bcc_mapping[node][2*(result->nof_bcc_per_node[node] - 1)] = u;
        result->node_to_bcc_mapping[node][2*(result->nof_bcc_per_node[node] - 1)+1] = result->nof_nodes_per_bcc[u]++;

        result->node_from_bcc_mapping[u] = realloc(result->node_from_bcc_mapping[u],
            result->nof_nodes_per_bcc[u] * sizeof(**result->node_from_bcc_mapping));
        result->node_from_bcc_mapping[u][result->nof_nodes_per_bcc[u]-1] = node;
      }
    }
  }

  for (u = 0; u < nof_nontrivial_bcc; ++u) {
    result->bcc_graphs[u] = RDL_initNewGraph(result->nof_nodes_per_bcc[u]);
  }

  for (i = 0; i < graph->E; ++i) {
    u = result->edge_to_bcc_mapping[i][0];

    /* skip if there is no BCC */
    if (u == RDL_NO_RINGSYSTEM) {
      continue;
    }

    ii[0] = ii[1] = RDL_NO_RINGSYSTEM;

    for (k = 0; k <= 1; ++ k) {
      for (j = 0; j < result->nof_bcc_per_node[graph->edges[i][k]]; ++j) {
        if (result->node_to_bcc_mapping[graph->edges[i][k]][2 * j] == u) {
          ii[k] = result->node_to_bcc_mapping[graph->edges[i][k]][2 * j + 1];
        }
      }
      if (ii[k] == RDL_NO_RINGSYSTEM) {
        RDL_outputFunc(RDL_ERROR, "node %u not part of BCC %u!\n",
            graph->edges[i][k], u);
        /* should never happen */
        assert(0);
      }
    }
    RDL_addUEdge(result->bcc_graphs[u], ii[0], ii[1]);
  }

  free(bcc);
  free(bcc_size);
  free(non_trivial_mapping);

  return result;
}